

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compaction_callback_test(bool multi_kv)

{
  fdb_kvs_handle *handle;
  int iVar1;
  fdb_status fVar2;
  size_t keylen;
  size_t valuelen;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  char *__format;
  undefined7 in_register_00000039;
  cb_args cb_args;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  undefined8 local_388;
  undefined8 uStack_380;
  fdb_kvs_handle *local_378;
  fdb_kvs_handle *local_370;
  fdb_file_handle *local_368;
  int local_35c;
  fdb_kvs_config local_358;
  timeval local_340;
  fdb_config local_330;
  char local_238 [256];
  char local_138 [264];
  
  gettimeofday(&local_340,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_378 = (fdb_kvs_handle *)0x0;
  local_388 = 0;
  uStack_380 = 0;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_cb = compaction_cb;
  local_330.compaction_cb_mask = 0x1b;
  local_330.multi_kv_instances = multi_kv;
  local_330.compaction_cb_ctx = &local_388;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_open(&local_368,"./compact_test1",&local_330);
  local_35c = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_35c == 0) {
    fdb_kvs_open_default(local_368,&local_370,&local_358);
  }
  else {
    fdb_kvs_open(local_368,&local_370,"db",&local_358);
  }
  local_378 = local_370;
  uVar5 = 0;
  while (uVar5 != 1000) {
    sprintf(local_138,"key%04d",(ulong)uVar5);
    sprintf(local_238,"body%04d",(ulong)uVar5);
    handle = local_370;
    keylen = strlen(local_138);
    valuelen = strlen(local_238);
    fVar2 = fdb_set_kv(handle,local_138,keylen,local_238,valuelen);
    uVar5 = uVar5 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x91);
      compaction_callback_test(bool)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x91,"void compaction_callback_test(bool)");
    }
  }
  fVar2 = fdb_commit(local_368,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x94);
    compaction_callback_test(bool)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x94,"void compaction_callback_test(bool)");
  }
  fVar2 = fdb_compact(local_368,"./compact_test2");
  iVar1 = local_35c;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x96);
    compaction_callback_test(bool)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x96,"void compaction_callback_test(bool)");
  }
  if ((int)local_388 != 1000) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x98);
    compaction_callback_test(bool)::__test_pass = 1;
    if ((int)local_388 != 1000) {
      __assert_fail("cb_args.n_moved_docs == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x98,"void compaction_callback_test(bool)");
    }
  }
  if ((char)uStack_380 == '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x99);
    compaction_callback_test(bool)::__test_pass = 1;
    if ((char)uStack_380 == '\0') {
      __assert_fail("cb_args.begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x99,"void compaction_callback_test(bool)");
    }
  }
  if (uStack_380._1_1_ == '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x9a);
    compaction_callback_test(bool)::__test_pass = 1;
    if (uStack_380._1_1_ == '\0') {
      __assert_fail("cb_args.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9a,"void compaction_callback_test(bool)");
    }
  }
  if (uStack_380._2_1_ == '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x9b);
    compaction_callback_test(bool)::__test_pass = 1;
    if (uStack_380._2_1_ == '\0') {
      __assert_fail("cb_args.wal_flush",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9b,"void compaction_callback_test(bool)");
    }
  }
  fdb_close(local_368);
  local_378 = (fdb_kvs_handle *)0x0;
  local_388 = 0;
  uStack_380 = 0;
  local_330.compaction_cb_mask = 0x19;
  fdb_open(&local_368,"./compact_test2",&local_330);
  cVar4 = (char)iVar1;
  if (cVar4 == '\0') {
    fdb_kvs_open_default(local_368,&local_370,&local_358);
  }
  else {
    fdb_kvs_open(local_368,&local_370,"db",&local_358);
  }
  local_378 = local_370;
  fVar2 = fdb_compact(local_368,"./compact_test3");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xac);
    compaction_callback_test(bool)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xac,"void compaction_callback_test(bool)");
  }
  if ((int)local_388 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xad);
    compaction_callback_test(bool)::__test_pass = 1;
    if ((int)local_388 != 0) {
      __assert_fail("cb_args.n_moved_docs == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xad,"void compaction_callback_test(bool)");
    }
  }
  if ((char)uStack_380 == '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xae);
    compaction_callback_test(bool)::__test_pass = 1;
    if ((char)uStack_380 == '\0') {
      __assert_fail("cb_args.begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xae,"void compaction_callback_test(bool)");
    }
  }
  if (uStack_380._1_1_ == '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xaf);
    compaction_callback_test(bool)::__test_pass = 1;
    if (uStack_380._1_1_ == '\0') {
      __assert_fail("cb_args.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xaf,"void compaction_callback_test(bool)");
    }
  }
  if (uStack_380._2_1_ == '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb0);
    compaction_callback_test(bool)::__test_pass = 1;
    if (uStack_380._2_1_ == '\0') {
      __assert_fail("cb_args.wal_flush",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb0,"void compaction_callback_test(bool)");
    }
  }
  fdb_close(local_368);
  local_378 = (fdb_kvs_handle *)0x0;
  local_388 = 0;
  uStack_380 = 0;
  local_330.compaction_cb_mask = 0x13;
  fdb_open(&local_368,"./compact_test3",&local_330);
  if (cVar4 == '\0') {
    fdb_kvs_open_default(local_368,&local_370,&local_358);
  }
  else {
    fdb_kvs_open(local_368,&local_370,"db",&local_358);
  }
  local_378 = local_370;
  fVar2 = fdb_compact(local_368,"./compact_test4");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if ((int)local_388 != 1000) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xc1);
      compaction_callback_test(bool)::__test_pass = 1;
      if ((int)local_388 != 1000) {
        __assert_fail("cb_args.n_moved_docs == n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xc1,"void compaction_callback_test(bool)");
      }
    }
    if ((char)uStack_380 == '\0') {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xc2);
      compaction_callback_test(bool)::__test_pass = 1;
      if ((char)uStack_380 == '\0') {
        __assert_fail("cb_args.begin",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xc2,"void compaction_callback_test(bool)");
      }
    }
    if (uStack_380._1_1_ == '\0') {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xc3);
      compaction_callback_test(bool)::__test_pass = 1;
      if (uStack_380._1_1_ == '\0') {
        __assert_fail("cb_args.end",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xc3,"void compaction_callback_test(bool)");
      }
    }
    if (uStack_380._2_1_ == '\x01') {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xc4);
      compaction_callback_test(bool)::__test_pass = 1;
      if (uStack_380._2_1_ == '\x01') {
        __assert_fail("!cb_args.wal_flush",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xc4,"void compaction_callback_test(bool)");
      }
    }
    fdb_close(local_368);
    local_378 = (fdb_kvs_handle *)0x0;
    local_388 = 0;
    uStack_380 = 0;
    local_330.compaction_cb_mask = 10;
    fdb_open(&local_368,"./compact_test4",&local_330);
    if (cVar4 == '\0') {
      fdb_kvs_open_default(local_368,&local_370,&local_358);
    }
    else {
      fdb_kvs_open(local_368,&local_370,"db",&local_358);
    }
    local_378 = local_370;
    fVar2 = fdb_compact(local_368,"./compact_test5");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xd3);
      compaction_callback_test(bool)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd3,"void compaction_callback_test(bool)");
    }
    if ((int)local_388 != 1000) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xd4);
      compaction_callback_test(bool)::__test_pass = 1;
      if ((int)local_388 != 1000) {
        __assert_fail("cb_args.n_moved_docs == n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xd4,"void compaction_callback_test(bool)");
      }
    }
    if ((char)uStack_380 == '\x01') {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xd5);
      compaction_callback_test(bool)::__test_pass = 1;
      if ((char)uStack_380 == '\x01') {
        __assert_fail("!cb_args.begin",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xd5,"void compaction_callback_test(bool)");
      }
    }
    if (uStack_380._1_1_ == '\x01') {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xd6);
      compaction_callback_test(bool)::__test_pass = 1;
      if (uStack_380._1_1_ == '\x01') {
        __assert_fail("!cb_args.end",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xd6,"void compaction_callback_test(bool)");
      }
    }
    if (uStack_380._2_1_ == '\0') {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xd7);
      compaction_callback_test(bool)::__test_pass = 1;
      if (uStack_380._2_1_ == '\0') {
        __assert_fail("cb_args.wal_flush",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xd7,"void compaction_callback_test(bool)");
      }
    }
    fdb_close(local_368);
    local_378 = (fdb_kvs_handle *)0x0;
    local_388 = 0;
    uStack_380 = 0;
    local_330.compaction_cb_mask = 4;
    fdb_open(&local_368,"./compact_test5",&local_330);
    if (cVar4 == '\0') {
      fdb_kvs_open_default(local_368,&local_370,&local_358);
    }
    else {
      fdb_kvs_open(local_368,&local_370,"db",&local_358);
    }
    local_378 = local_370;
    fVar2 = fdb_compact(local_368,"./compact_test6");
    if (fVar2 == FDB_RESULT_SUCCESS) {
      if ((int)local_388 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xe6);
        compaction_callback_test(bool)::__test_pass = 1;
        if ((int)local_388 != 0) {
          __assert_fail("cb_args.n_moved_docs == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xe6,"void compaction_callback_test(bool)");
        }
      }
      if (local_388._4_4_ == 0 || 1000 < local_388._4_4_) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xe7);
        compaction_callback_test(bool)::__test_pass = 1;
        if ((local_388._4_4_ == 0) || (1000 < local_388._4_4_)) {
          __assert_fail("cb_args.n_batch_move && cb_args.n_batch_move <= n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xe7,"void compaction_callback_test(bool)");
        }
      }
      if ((char)uStack_380 == '\x01') {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xe8);
        compaction_callback_test(bool)::__test_pass = 1;
        if ((char)uStack_380 == '\x01') {
          __assert_fail("!cb_args.begin",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xe8,"void compaction_callback_test(bool)");
        }
      }
      if (uStack_380._1_1_ == '\x01') {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xe9);
        compaction_callback_test(bool)::__test_pass = 1;
        if (uStack_380._1_1_ == '\x01') {
          __assert_fail("!cb_args.end",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xe9,"void compaction_callback_test(bool)");
        }
      }
      if (uStack_380._2_1_ == '\x01') {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xea);
        compaction_callback_test(bool)::__test_pass = 1;
        if (uStack_380._2_1_ == '\x01') {
          __assert_fail("!cb_args.wal_flush",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xea,"void compaction_callback_test(bool)");
        }
      }
      fdb_close(local_368);
      fdb_shutdown();
      memleak_end();
      if (cVar4 == '\0') {
        if ((compaction_callback_test(bool)::__test_pass & 1) == 0) {
          __format = "%s PASSED\n";
        }
        else {
          __format = "%s FAILED\n";
        }
        pcVar3 = "compaction callback function single kv mode test";
      }
      else {
        if ((compaction_callback_test(bool)::__test_pass & 1) == 0) {
          __format = "%s PASSED\n";
        }
        else {
          __format = "%s FAILED\n";
        }
        pcVar3 = "compaction callback function multi kv mode test";
      }
      fprintf(_stderr,__format,pcVar3);
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xe5);
    compaction_callback_test(bool)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xe5,"void compaction_callback_test(bool)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xc0);
  compaction_callback_test(bool)::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xc0,"void compaction_callback_test(bool)");
}

Assistant:

void compaction_callback_test(bool multi_kv)
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = compaction_cb;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;
    fconfig.multi_kv_instances = multi_kv;

    // remove all previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;

    // write docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        sprintf(bodybuf, "body%04d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_compact(dbfile, "./compact_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without move doc
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;
    fdb_open(&dbfile, "./compact_test2", &fconfig);

    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test3");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == 0);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without wal_flush
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_END;
    fdb_open(&dbfile, "./compact_test3", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test4");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(!cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without begin/end
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL;
    fdb_open(&dbfile, "./compact_test4", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test5");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(!cb_args.begin);
    TEST_CHK(!cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db with batch move
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BATCH_MOVE;
    fdb_open(&dbfile, "./compact_test5", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test6");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == 0);
    TEST_CHK(cb_args.n_batch_move && cb_args.n_batch_move <= n);
    TEST_CHK(!cb_args.begin);
    TEST_CHK(!cb_args.end);
    TEST_CHK(!cb_args.wal_flush);
    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();
    if (multi_kv) {
        TEST_RESULT("compaction callback function multi kv mode test");
    } else {
        TEST_RESULT("compaction callback function single kv mode test");
    }
}